

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O3

OPJ_BOOL opj_jp2_write_jp2h(opj_jp2_t *jp2,opj_stream_private_t *stream,opj_event_mgr_t *p_manager)

{
  long lVar1;
  OPJ_SIZE_T OVar2;
  OPJ_UINT32 p_value;
  OPJ_BOOL OVar3;
  int iVar4;
  long lVar5;
  OPJ_BYTE l_jp2h_data [8];
  OPJ_BYTE local_a0 [4];
  OPJ_BYTE local_9c [4];
  code *local_98;
  long lStack_90;
  uint local_88 [2];
  code *pcStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  code *local_68 [7];
  
  if (stream == (opj_stream_private_t *)0x0) {
    __assert_fail("stream != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0x61e,
                  "OPJ_BOOL opj_jp2_write_jp2h(opj_jp2_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (jp2 == (opj_jp2_t *)0x0) {
    __assert_fail("jp2 != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0x61f,
                  "OPJ_BOOL opj_jp2_write_jp2h(opj_jp2_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0x620,
                  "OPJ_BOOL opj_jp2_write_jp2h(opj_jp2_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  local_68[4] = (code *)0x0;
  local_68[5] = (code *)0x0;
  local_68[2] = (code *)0x0;
  local_68[3] = (code *)0x0;
  local_68[0] = (code *)0x0;
  local_68[1] = (code *)0x0;
  local_78 = 0;
  uStack_70 = 0;
  local_88[0] = 0;
  local_88[1] = 0;
  lStack_90 = 0;
  if (jp2->bpc == 0xff) {
    local_68[0] = opj_jp2_write_colr;
    lVar5 = 3;
    pcStack_80 = opj_jp2_write_bpcc;
  }
  else {
    lVar5 = 2;
    pcStack_80 = opj_jp2_write_colr;
  }
  iVar4 = (int)lVar5;
  local_98 = opj_jp2_write_ihdr;
  if ((jp2->color).jp2_cdef != (opj_jp2_cdef_t *)0x0) {
    (&local_98)[lVar5 * 3] = opj_jp2_write_cdef;
    iVar4 = iVar4 + 1;
  }
  opj_write_bytes_LE(local_9c,0x6a703268,4);
  p_value = 8;
  lVar5 = 0;
  do {
    lVar1 = (**(code **)((long)&local_98 + lVar5))(jp2,(long)local_88 + lVar5);
    *(long *)((long)&lStack_90 + lVar5) = lVar1;
    if (lVar1 == 0) {
      lVar5 = 0;
      opj_event_msg(p_manager,1,"Not enough memory to hold JP2 Header data\n");
      do {
        if (*(void **)((long)&lStack_90 + lVar5) != (void *)0x0) {
          opj_free(*(void **)((long)&lStack_90 + lVar5));
        }
        lVar5 = lVar5 + 0x18;
      } while (iVar4 * 0x18 != (int)lVar5);
      return 0;
    }
    p_value = p_value + *(int *)((long)local_88 + lVar5);
    lVar5 = lVar5 + 0x18;
  } while (iVar4 * 0x18 != (int)lVar5);
  opj_write_bytes_LE(local_a0,p_value,4);
  OVar2 = opj_stream_write_data(stream,local_a0,8,p_manager);
  if (OVar2 == 8) {
    lVar5 = 0;
    do {
      OVar2 = opj_stream_write_data
                        (stream,*(OPJ_BYTE **)((long)&lStack_90 + lVar5),
                         (ulong)*(uint *)((long)local_88 + lVar5),p_manager);
      if (OVar2 != *(uint *)((long)local_88 + lVar5)) goto LAB_0011b4f7;
      lVar5 = lVar5 + 0x18;
    } while (iVar4 * 0x18 != (int)lVar5);
    OVar3 = 1;
  }
  else {
LAB_0011b4f7:
    OVar3 = 0;
    opj_event_msg(p_manager,1,"Stream error while writing JP2 Header box\n");
  }
  lVar5 = 0;
  do {
    if (*(void **)((long)&lStack_90 + lVar5) != (void *)0x0) {
      opj_free(*(void **)((long)&lStack_90 + lVar5));
    }
    lVar5 = lVar5 + 0x18;
  } while (iVar4 * 0x18 != (int)lVar5);
  return OVar3;
}

Assistant:

static OPJ_BOOL opj_jp2_write_jp2h(opj_jp2_t *jp2,
                            opj_stream_private_t *stream,
                            opj_event_mgr_t * p_manager
                            )
{
	opj_jp2_img_header_writer_handler_t l_writers [4];
	opj_jp2_img_header_writer_handler_t * l_current_writer;

	OPJ_INT32 i, l_nb_pass;
	/* size of data for super box*/
	OPJ_UINT32 l_jp2h_size = 8;
	OPJ_BOOL l_result = OPJ_TRUE;

	/* to store the data of the super box */
	OPJ_BYTE l_jp2h_data [8];
	
	/* preconditions */
	assert(stream != 00);
	assert(jp2 != 00);
	assert(p_manager != 00);

	memset(l_writers,0,sizeof(l_writers));

	if (jp2->bpc == 255) {
		l_nb_pass = 3;
		l_writers[0].handler = opj_jp2_write_ihdr;
		l_writers[1].handler = opj_jp2_write_bpcc;
		l_writers[2].handler = opj_jp2_write_colr;
	}
	else {
		l_nb_pass = 2;
		l_writers[0].handler = opj_jp2_write_ihdr;
		l_writers[1].handler = opj_jp2_write_colr;
	}
	
	if (jp2->color.jp2_cdef != NULL) {
		l_writers[l_nb_pass].handler = opj_jp2_write_cdef;
		l_nb_pass++;
	}
	
	/* write box header */
	/* write JP2H type */
	opj_write_bytes(l_jp2h_data+4,JP2_JP2H,4);

	l_current_writer = l_writers;
	for (i=0;i<l_nb_pass;++i) {
		l_current_writer->m_data = l_current_writer->handler(jp2,&(l_current_writer->m_size));
		if (l_current_writer->m_data == 00) {
			opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to hold JP2 Header data\n");
			l_result = OPJ_FALSE;
			break;
		}

		l_jp2h_size += l_current_writer->m_size;
		++l_current_writer;
	}

	if (! l_result) {
		l_current_writer = l_writers;
		for (i=0;i<l_nb_pass;++i) {
			if (l_current_writer->m_data != 00) {
				opj_free(l_current_writer->m_data );
			}
			++l_current_writer;
		}

		return OPJ_FALSE;
	}

	/* write super box size */
	opj_write_bytes(l_jp2h_data,l_jp2h_size,4);
	
	/* write super box data on stream */
	if (opj_stream_write_data(stream,l_jp2h_data,8,p_manager) != 8) {
		opj_event_msg(p_manager, EVT_ERROR, "Stream error while writing JP2 Header box\n");
		l_result = OPJ_FALSE;
	}
	
	if (l_result) {
		l_current_writer = l_writers;
		for (i=0;i<l_nb_pass;++i) {
			if (opj_stream_write_data(stream,l_current_writer->m_data,l_current_writer->m_size,p_manager) != l_current_writer->m_size) {
				opj_event_msg(p_manager, EVT_ERROR, "Stream error while writing JP2 Header box\n");
				l_result = OPJ_FALSE;
				break;
			}
			++l_current_writer;
		}
	}

	l_current_writer = l_writers;
	
	/* cleanup */
	for (i=0;i<l_nb_pass;++i) {
		if (l_current_writer->m_data != 00) {
			opj_free(l_current_writer->m_data );
		}
		++l_current_writer;
	}

	return l_result;
}